

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O2

String * __thiscall asl::IniFile::operator[](IniFile *this,String *name)

{
  int j;
  Map<asl::String,_asl::String> *pMVar1;
  String *pSVar2;
  String local_50;
  String sec;
  
  j = String::indexOf(name,'/',0);
  if (-1 < j) {
    String::substring(&sec,name,0,j);
    pMVar1 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&sec)->
              super_Map<asl::String,_asl::String>;
    String::substring(&local_50,name,j + 1);
    pSVar2 = Map<asl::String,_asl::String>::operator[](pMVar1,&local_50);
    String::~String(&local_50);
    String::~String(&sec);
    return pSVar2;
  }
  pMVar1 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                      ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
            super_Map<asl::String,_asl::String>;
  pSVar2 = Map<asl::String,_asl::String>::operator[](pMVar1,name);
  return pSVar2;
}

Assistant:

String& IniFile::operator[](const String& name)
{
	int slash = name.indexOf('/');
	if(slash < 0)
	{
		return _sections[_currentTitle][name];
	}
	else
	{
		String sec = name.substring(0, slash);
		Section& section = _sections[sec];
		return section[name.substring(slash + 1)];
	}
}